

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O1

void wasm::makeClampLimitLiterals<long,double>(Literal *iMin,Literal *fMin,Literal *fMax)

{
  anon_union_16_5_9943fe1e_for_Literal_0 local_38;
  undefined8 local_28;
  
  local_38.i64 = -0x8000000000000000;
  local_28 = 3;
  Literal::operator=(iMin,(Literal *)&local_38.func);
  Literal::~Literal((Literal *)&local_38.func);
  local_38.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0xc3e0000000000000;
  local_28 = 5;
  Literal::operator=(fMin,(Literal *)&local_38.func);
  Literal::~Literal((Literal *)&local_38.func);
  local_38.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x43e0000000000000;
  local_28 = 5;
  Literal::operator=(fMax,(Literal *)&local_38.func);
  Literal::~Literal((Literal *)&local_38.func);
  return;
}

Assistant:

void makeClampLimitLiterals(Literal& iMin, Literal& fMin, Literal& fMax) {
  IntType minVal = std::numeric_limits<IntType>::min();
  IntType maxVal = std::numeric_limits<IntType>::max();
  iMin = Literal(minVal);
  fMin = Literal(FloatType(minVal) - 1);
  fMax = Literal(FloatType(maxVal) + 1);
}